

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginGlobal
          (BinaryReaderInterp *this,Index index,Type type,bool mutable_)

{
  FuncDesc *this_00;
  Offset OVar1;
  ModuleDesc *pMVar2;
  char *pcVar3;
  Result RVar4;
  GlobalType global_type;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_158;
  Location loc;
  FuncDesc local_a8;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  pcVar3 = (this->filename_)._M_str;
  loc.filename._M_str._0_4_ = SUB84(pcVar3,0);
  loc.filename._M_str._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = (int)OVar1;
  loc.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
  RVar4 = SharedValidator::OnGlobal(&this->validator_,&loc,type,mutable_);
  if (RVar4.enum_ != Error) {
    global_type.super_ExternType.kind = Global;
    global_type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001d8310;
    global_type.mut = (Mutability)mutable_;
    local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178 = 0;
    uStack_170 = 0;
    local_168 = 0;
    global_type._12_8_ = type;
    loc.filename._M_len = (size_t)type;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_178,&loc);
    FuncType::FuncType(&local_a8.type,(ValueTypes *)&local_158,(ValueTypes *)&local_178);
    local_a8.locals.
    super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.locals.
    super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.locals.
    super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.code_offset = 0xffffffff;
    local_a8.handlers.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.handlers.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.handlers.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_178);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_158);
    pMVar2 = this->module_;
    loc.filename._M_str._0_4_ = 3;
    loc.filename._M_len = (size_t)&PTR__ExternType_001d8310;
    loc.filename._M_str._4_4_ = global_type.super_ExternType._12_4_;
    loc.field_1.field_0.line = global_type._16_4_;
    loc.field_1.field_0.first_column = global_type.mut;
    this_00 = (FuncDesc *)((long)&loc.field_1 + 8);
    FuncDesc::FuncDesc(this_00,&local_a8);
    std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::
    emplace_back<wabt::interp::GlobalDesc>(&pMVar2->globals,(GlobalDesc *)&loc);
    FuncDesc::~FuncDesc(this_00);
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,&global_type);
    FuncDesc::~FuncDesc(&local_a8);
  }
  return (Result)(uint)(RVar4.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::BeginGlobal(Index index, Type type, bool mutable_) {
  CHECK_RESULT(validator_.OnGlobal(GetLocation(), type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  FuncDesc init_func{FuncType{{}, {type}}, {}, Istream::kInvalidOffset, {}};
  module_.globals.push_back(GlobalDesc{global_type, init_func});
  global_types_.push_back(global_type);
  return Result::Ok;
}